

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O2

string * __thiscall
cfd::core::ScriptOperator::ToCodeString_abi_cxx11_
          (string *__return_storage_ptr__,ScriptOperator *this)

{
  string *__lhs;
  bool bVar1;
  char *pcVar2;
  string sStack_38;
  
  __lhs = &this->text_data_;
  bVar1 = ::std::operator==(__lhs,"0");
  if (bVar1) {
    pcVar2 = "OP_0";
  }
  else {
    bVar1 = ::std::operator==(__lhs,"-1");
    if (bVar1) {
      pcVar2 = "OP_1NEGATE";
    }
    else {
      bVar1 = ::std::operator==(__lhs,"1");
      if (!bVar1) {
        if (this->data_type_ - kOp_2 < 0xf) {
          ::std::__cxx11::to_string(&sStack_38,this->data_type_ - kOpReserved);
          ::std::operator+(__return_storage_ptr__,"OP_",&sStack_38);
          ::std::__cxx11::string::~string((string *)&sStack_38);
          return __return_storage_ptr__;
        }
        ToString_abi_cxx11_(__return_storage_ptr__,this);
        return __return_storage_ptr__;
      }
      pcVar2 = "OP_1";
    }
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,(allocator *)&sStack_38);
  return __return_storage_ptr__;
}

Assistant:

std::string ScriptOperator::ToCodeString() const {
  if (text_data_ == "0") {
    return "OP_0";
  } else if (text_data_ == "-1") {
    return "OP_1NEGATE";
  } else if (text_data_ == "1") {
    return "OP_1";
  } else if (
      (data_type_ >= ScriptType::kOp_2) &&
      (data_type_ <= ScriptType::kOp_16)) {
    int num = static_cast<int>(data_type_);
    num -= static_cast<int>(ScriptType::kOp_1);
    num += 1;
    return "OP_" + std::to_string(num);
  }
  return ToString();
}